

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *piMinKey,i64 maxKey)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ushort uVar4;
  u16 uVar5;
  int iVar6;
  u32 iChild;
  uint uVar7;
  bool bVar8;
  int j;
  int size_1;
  u32 size;
  Pgno pgnoOvfl;
  u32 nPage;
  CellInfo info;
  u8 savedIsInit;
  int saved_v2;
  int saved_v1;
  char *saved_zPfx;
  u32 prev;
  u32 x;
  u32 *heap;
  u32 local_90;
  u32 contentOffset;
  u32 usableSize;
  u32 pc;
  BtShared *pBt;
  u8 *pCellIdx;
  u8 *pCell;
  u8 *data;
  int local_60;
  int keyCanBeEqual;
  int doCoverageCheck;
  int nCell;
  int cellStart;
  int hdr;
  int nFrag;
  int pgno;
  int d2;
  int depth;
  int rc;
  int i;
  MemPage *pPage;
  i64 maxKey_local;
  i64 *piMinKey_local;
  IntegrityCk *pIStack_18;
  int iPage_local;
  IntegrityCk *pCheck_local;
  
  _rc = (MemPage *)0x0;
  pgno = -1;
  local_60 = 1;
  data._4_4_ = 1;
  _prev = (u32 *)0x0;
  saved_zPfx._0_4_ = 0;
  pcVar3 = pCheck->zPfx;
  iVar1 = pCheck->v1;
  iVar2 = pCheck->v2;
  info.nSize._1_1_ = '\0';
  _usableSize = pCheck->pBt;
  local_90 = _usableSize->usableSize;
  if (iPage == 0) {
    pCheck_local._4_4_ = 0;
  }
  else {
    pPage = (MemPage *)maxKey;
    maxKey_local = (i64)piMinKey;
    piMinKey_local._4_4_ = iPage;
    pIStack_18 = pCheck;
    iVar6 = checkRef(pCheck,iPage);
    if (iVar6 == 0) {
      pIStack_18->zPfx = "Page %d: ";
      pIStack_18->v1 = piMinKey_local._4_4_;
      d2 = btreeGetPage(_usableSize,piMinKey_local._4_4_,(MemPage **)&rc,0);
      if (d2 == 0) {
        info.nSize._1_1_ = _rc->isInit;
        _rc->isInit = '\0';
        d2 = btreeInitPage(_rc);
        if (d2 == 0) {
          d2 = btreeComputeFreeSpace(_rc);
          if (d2 == 0) {
            pCell = _rc->aData;
            nCell = (int)_rc->hdrOffset;
            pIStack_18->zPfx = "On tree page %d cell %d: ";
            heap._4_4_ = (CONCAT11(pCell[(int)(nCell + 5)],pCell[(long)(int)(nCell + 5) + 1]) - 1 &
                         0xffff) + 1;
            keyCanBeEqual = (int)CONCAT11(pCell[(int)(nCell + 3)],pCell[(long)(int)(nCell + 3) + 1])
            ;
            doCoverageCheck = nCell + 0xcU + (uint)_rc->leaf * -4;
            pBt = (BtShared *)(pCell + (int)(doCoverageCheck + (keyCanBeEqual - 1U) * 2));
            if (_rc->leaf == '\0') {
              hdr = sqlite3Get4byte(pCell + (int)(nCell + 8));
              if (_usableSize->autoVacuum != '\0') {
                pIStack_18->zPfx = "On page %d at right child: ";
                checkPtrmap(pIStack_18,hdr,'\x05',piMinKey_local._4_4_);
              }
              pgno = checkTreePage(pIStack_18,hdr,(i64 *)&pPage,(i64)pPage);
              data._4_4_ = 0;
              depth = keyCanBeEqual;
            }
            else {
              _prev = pIStack_18->heap;
              *_prev = 0;
              depth = keyCanBeEqual;
            }
            while( true ) {
              depth = depth - 1;
              bVar8 = false;
              if (-1 < depth) {
                bVar8 = pIStack_18->mxErr != 0;
              }
              if (!bVar8) break;
              pIStack_18->v2 = depth;
              contentOffset =
                   (u32)CONCAT11(*(undefined1 *)&pBt->pPager,*(undefined1 *)((long)&pBt->pPager + 1)
                                );
              pBt = (BtShared *)((long)&pBt[-1].pTmpSpace + 6);
              if ((contentOffset < heap._4_4_) || (local_90 - 4 < contentOffset)) {
                checkAppendMsg(pIStack_18,"Offset %d out of range %d..%d",(ulong)contentOffset,
                               (ulong)heap._4_4_,(ulong)(local_90 - 4));
                local_60 = 0;
              }
              else {
                pCellIdx = pCell + contentOffset;
                (*_rc->xParseCell)(_rc,pCellIdx,(CellInfo *)&pgnoOvfl);
                if (local_90 < contentOffset + info.pPayload._6_2_) {
                  checkAppendMsg(pIStack_18,"Extends off end of page");
                  local_60 = 0;
                }
                else {
                  if (_rc->intKey != '\0') {
                    if (data._4_4_ == 0) {
                      if ((long)pPage <= (long)_pgnoOvfl) goto LAB_0019a469;
                    }
                    else if ((long)pPage < (long)_pgnoOvfl) {
LAB_0019a469:
                      checkAppendMsg(pIStack_18,"Rowid %lld out of order",_pgnoOvfl);
                    }
                    pPage = _pgnoOvfl;
                    data._4_4_ = 0;
                  }
                  if (info.pPayload._4_2_ < (uint)info.pPayload) {
                    iVar6 = ((uint)info.pPayload - info.pPayload._4_2_) + local_90;
                    uVar7 = local_90 - 4;
                    iChild = sqlite3Get4byte(pCellIdx + (int)(info.pPayload._6_2_ - 4));
                    if (_usableSize->autoVacuum != '\0') {
                      checkPtrmap(pIStack_18,iChild,'\x03',piMinKey_local._4_4_);
                    }
                    checkList(pIStack_18,0,iChild,(iVar6 - 5U) / uVar7);
                  }
                  if (_rc->leaf == '\0') {
                    hdr = sqlite3Get4byte(pCellIdx);
                    if (_usableSize->autoVacuum != '\0') {
                      checkPtrmap(pIStack_18,hdr,'\x05',piMinKey_local._4_4_);
                    }
                    nFrag = checkTreePage(pIStack_18,hdr,(i64 *)&pPage,(i64)pPage);
                    data._4_4_ = 0;
                    if (nFrag != pgno) {
                      checkAppendMsg(pIStack_18,"Child page depth differs");
                      pgno = nFrag;
                    }
                  }
                  else {
                    btreeHeapInsert(_prev,contentOffset << 0x10 |
                                          (contentOffset + info.pPayload._6_2_) - 1);
                  }
                }
              }
            }
            *(MemPage **)maxKey_local = pPage;
            pIStack_18->zPfx = (char *)0x0;
            if ((local_60 != 0) && (0 < pIStack_18->mxErr)) {
              if (_rc->leaf == '\0') {
                _prev = pIStack_18->heap;
                *_prev = 0;
                depth = keyCanBeEqual;
                while (depth = depth + -1, -1 < depth) {
                  contentOffset =
                       (u32)CONCAT11(pCell[doCoverageCheck + depth * 2],
                                     pCell[(long)(doCoverageCheck + depth * 2) + 1]);
                  uVar5 = (*_rc->xCellSize)(_rc,pCell + contentOffset);
                  btreeHeapInsert(_prev,contentOffset << 0x10 | (contentOffset + uVar5) - 1);
                }
              }
              uVar4 = CONCAT11(pCell[nCell + 1],pCell[(long)(nCell + 1) + 1]);
              while (depth = (int)uVar4, depth != 0) {
                btreeHeapInsert(_prev,depth << 0x10 |
                                      (depth + (uint)CONCAT11(pCell[depth + 2],
                                                              pCell[(long)(depth + 2) + 1])) - 1);
                uVar4 = CONCAT11(pCell[depth],pCell[(long)depth + 1]);
              }
              cellStart = 0;
              saved_zPfx._0_4_ = heap._4_4_ - 1;
              while (iVar6 = btreeHeapPull(_prev,(u32 *)((long)&saved_zPfx + 4)), iVar6 != 0) {
                if (saved_zPfx._4_4_ >> 0x10 <= ((uint)saved_zPfx & 0xffff)) {
                  checkAppendMsg(pIStack_18,"Multiple uses for byte %u of page %d",
                                 (ulong)(saved_zPfx._4_4_ >> 0x10),(ulong)piMinKey_local._4_4_);
                  break;
                }
                cellStart = ((saved_zPfx._4_4_ >> 0x10) - ((uint)saved_zPfx & 0xffff)) + -1 +
                            cellStart;
                saved_zPfx._0_4_ = saved_zPfx._4_4_;
              }
              cellStart = (local_90 - ((uint)saved_zPfx & 0xffff)) + -1 + cellStart;
              if ((*_prev == 0) && (cellStart != (uint)pCell[nCell + 7])) {
                checkAppendMsg(pIStack_18,"Fragmentation of %d bytes reported as %d on page %d",
                               (ulong)(uint)cellStart,(ulong)pCell[nCell + 7],
                               (ulong)piMinKey_local._4_4_);
              }
            }
          }
          else {
            checkAppendMsg(pIStack_18,"free space corruption",(ulong)(uint)d2);
          }
        }
        else {
          checkAppendMsg(pIStack_18,"btreeInitPage() returns error code %d",(ulong)(uint)d2);
        }
      }
      else {
        checkAppendMsg(pIStack_18,"unable to get the page. error code=%d",(ulong)(uint)d2);
      }
      if (local_60 == 0) {
        _rc->isInit = info.nSize._1_1_;
      }
      releasePage(_rc);
      pIStack_18->zPfx = pcVar3;
      pIStack_18->v1 = iVar1;
      pIStack_18->v2 = iVar2;
      pCheck_local._4_4_ = pgno + 1;
    }
    else {
      pCheck_local._4_4_ = 0;
    }
  }
  return pCheck_local._4_4_;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %d cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %d at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. 
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or 
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    ** 
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.  
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %d", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}